

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterPlanTestConsolePool::RegisterPlanTestConsolePool(RegisterPlanTestConsolePool *this)

{
  RegisterTest(PlanTestConsolePool::Create,"PlanTest.ConsolePool");
  return;
}

Assistant:

TEST_F(PlanTest, ConsolePool) {
  TestPoolWithDepthOne(
"rule poolcat\n"
"  command = cat $in > $out\n"
"  pool = console\n"
"build out1: poolcat in\n"
"build out2: poolcat in\n");
}